

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  undefined1 uVar3;
  byte bVar4;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    uVar3 = 7;
    if (bVar1 - 0xd8 < 4) goto LAB_0015e223;
    if (bVar1 == 0) {
      uVar3 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      goto LAB_0015e223;
    }
  }
  else {
    if (bVar1 - 0xdc < 4) {
      uVar3 = 8;
      goto LAB_0015e223;
    }
    if ((bVar1 == 0xff) && (0xfd < (byte)ptr[1])) {
      uVar3 = 0;
      goto LAB_0015e223;
    }
  }
  uVar3 = 0x1d;
LAB_0015e223:
  switch(uVar3) {
  case 0x14:
    *nextTokPtr = ptr + 2;
    return 0x21;
  default:
switchD_0015e243_caseD_15:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    ptr = ptr + 2;
    if (ptr == end) {
      return -1;
    }
    break;
  case 0x1b:
    iVar2 = big2_scanComment(enc,ptr + 2,end,nextTokPtr);
    return iVar2;
  }
LAB_0015e25a:
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar4 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar4 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
      }
      else {
LAB_0015e2b1:
        bVar4 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar4 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_0015e2b1;
    bVar4 = 0;
  }
  switch(bVar4) {
  case 0x15:
    break;
  case 0x16:
  case 0x18:
    goto switchD_0015e2c9_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_0015e243_caseD_15;
  case 0x1e:
    if ((byte *)ptr + 2 == (byte *)end) {
      return -1;
    }
    bVar1 = ((byte *)ptr)[2];
    if (bVar1 < 0xdc) {
      bVar4 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar4 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
        }
        else {
LAB_0015e355:
          bVar4 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar4 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (((byte *)ptr)[3] < 0xfe)) goto LAB_0015e355;
      bVar4 = 0;
    }
    if ((bVar4 < 0x1f) && ((0x40200600U >> (bVar4 & 0x1f) & 1) != 0))
    goto switchD_0015e243_caseD_15;
    break;
  default:
    if (1 < bVar4 - 9) goto switchD_0015e243_caseD_15;
  }
  *nextTokPtr = ptr;
  return 0x10;
switchD_0015e2c9_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  if (ptr == end) {
    return -1;
  }
  goto LAB_0015e25a;
}

Assistant:

static
int PREFIX(scanDecl)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S: case BT_CR: case BT_LF: case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}